

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void adc_79(void)

{
  byte bVar1;
  byte bVar2;
  ubyte local_c;
  ushort local_a;
  uint answer;
  uint flags;
  
  except = '\0';
  bVar1 = getbyte(pc);
  bVar2 = getbyte(pc + 1);
  temp1 = getbyte((ushort)bVar1 + (ushort)bVar2 * 0x100 + (ushort)y_reg);
  asm("push ax");
  asm("CLC");
  if (carry_f != '\0') {
    asm("STC");
  }
  _AL = acc;
  _AH = temp1;
  asm("adc AL,AH");
  asm("pushf");
  asm("pop flags");
  asm("push AX");
  asm("pop answer");
  asm("pop AX");
  acc = local_c;
  result_f = local_c;
  ovr_f = (local_a & 0x800) != 0;
  carry_f = (byte)local_a & 1;
  pc = pc + 2;
  return;
}

Assistant:

void adc_79(void) {
    uint flags;
    uint answer;
    CLE;
    temp1 = getbyte(getbyte(pc) + 0x100 * getbyte(pc + 1) + y_reg);

    asm("push ax");

    asm("CLC");
    if (carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("adc AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("push AX");
    asm("pop answer");
    asm("pop AX");

    result_f = (acc = answer);
    (flags & 0x800) ? (ovr_f = 1) : (ovr_f = 0);
    carry_f = flags & 1;

    pc += 2;
}